

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall BN::operator>>=(BN *this,size_t shift)

{
  pointer puVar1;
  pointer puVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  BN local_38;
  
  if (shift != 0) {
    uVar4 = shift >> 4;
    if ((shift & 0xf) == 0) {
      divbt(&local_38,this,uVar4);
      if (&local_38 != this) {
        puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_start;
        (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar2 == (pointer)0x0) {
          return this;
        }
        operator_delete(puVar2);
      }
      if (local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar5 = (long)puVar1 - (long)puVar2 >> 1;
      if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,0);
        *(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start = 0;
      }
      else {
        lVar6 = uVar5 + ~uVar4;
        if (lVar6 != 0) {
          lVar7 = 0;
          bVar3 = (byte)shift & 0xf;
          do {
            puVar2[lVar7] =
                 puVar2[uVar4 + lVar7] >> bVar3 | puVar2[uVar4 + lVar7 + 1] << 0x10 - bVar3;
            lVar7 = lVar7 + 1;
          } while (lVar6 != lVar7);
        }
        puVar2[lVar6] = puVar1[-1] >> (sbyte)(shift & 0xf);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  (&this->ba,uVar5 - uVar4);
        puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar4 = (long)puVar2 -
                (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        while ((2 < uVar4 && (puVar2 = puVar2 + -1, *puVar2 == 0))) {
          (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar2;
          uVar4 = uVar4 - 2;
        }
      }
    }
  }
  return this;
}

Assistant:

BN& BN::operator >>= (size_t shift) {
    if (shift == 0)
        return *this;
    size_t baseshift = shift / bz8;
    size_t realshift = shift - baseshift * bz8;

    if (realshift == 0)
        return *this = divbt(baseshift);

    if (baseshift >= ba.size()) {
        ba.resize(0);
        ba[0] = 0;
        return *this;
    }

    for (size_t i = 0; i < ba.size() - baseshift - 1; ++i) {
        ba[i] =
            (ba[i + baseshift] >> realshift) |
            (ba[i + baseshift + 1] << (bz8 - realshift));
    }
    ba[ba.size() - baseshift - 1] = ba.back() >> realshift;
    ba.resize(ba.size() - baseshift);

    Norm(ba);
    return *this;
}